

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::ExternalCallEventLogEntry_ProcessArgs
               (EventLogEntry *evt,int32 rootDepth,JavascriptFunction *function,Arguments *args,
               bool checkExceptions,UnlinkableSlabAllocator *alloc)

{
  ExternalCallEventLogEntry *pEVar1;
  void **ppvVar2;
  TTDVar pvVar3;
  ulong sizeInBytes;
  uint uVar4;
  
  pEVar1 = GetInlineEventDataAs<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (evt);
  pEVar1->RootNestingDepth = rootDepth;
  uVar4 = (*(uint *)&args->Info & 0xffffff) + 1;
  pEVar1->ArgCount = uVar4;
  ppvVar2 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar4);
  pEVar1->ArgArray = ppvVar2;
  *ppvVar2 = function;
  sizeInBytes = (ulong)((*(uint *)&args->Info & 0xffffff) << 3);
  js_memcpy_s(pEVar1->ArgArray + 1,sizeInBytes,args->Values,sizeInBytes);
  if (((args->Info).field_0x3 & 0x40) == 0) {
    pvVar3 = (TTDVar)0x0;
  }
  else {
    pvVar3 = Js::Arguments::GetNewTarget(args);
  }
  pEVar1->NewTarget = pvVar3;
  pEVar1->ReturnValue = (TTDVar)0x0;
  pEVar1->LastNestedEventTime = 0x7fffffffffffffff;
  pEVar1->CheckExceptionStatus = checkExceptions;
  return;
}

Assistant:

void ExternalCallEventLogEntry_ProcessArgs(EventLogEntry* evt, int32 rootDepth, Js::JavascriptFunction* function, const Js::Arguments& args, bool checkExceptions, UnlinkableSlabAllocator& alloc)
        {
            ExternalCallEventLogEntry* callEvt = GetInlineEventDataAs<ExternalCallEventLogEntry, EventKind::ExternalCallTag>(evt);

            callEvt->RootNestingDepth = rootDepth;
            callEvt->ArgCount = args.Info.Count + 1;

            static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

            callEvt->ArgArray = alloc.SlabAllocateArray<TTDVar>(callEvt->ArgCount);
            callEvt->ArgArray[0] = static_cast<TTDVar>(function);
            js_memcpy_s(callEvt->ArgArray + 1, args.Info.Count * sizeof(TTDVar), args.Values, args.Info.Count * sizeof(Js::Var));

            if (args.HasNewTarget())
            {
                callEvt->NewTarget = static_cast<TTDVar>(args.GetNewTarget());
            }
            else
            {
                callEvt->NewTarget = nullptr;
            }

            callEvt->ReturnValue = nullptr;
            callEvt->LastNestedEventTime = TTD_EVENT_MAXTIME;

            callEvt->CheckExceptionStatus = checkExceptions;
        }